

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int imcomp_merge_overlap
              (char *tile,int pixlen,int ndim,long *tfpixel,long *tlpixel,char *bnullarray,
              char *image,long *fpixel,long *lpixel,int nullcheck,int *status)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long in_RCX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  long in_R8;
  bool bVar6;
  long in_stack_00000008;
  long in_stack_00000010;
  long in_stack_00000018;
  int overlap_flags;
  int overlap_bytes;
  int ii;
  long imgpixbyte;
  long tilepixbyte;
  long imgpix;
  long tilepix;
  long t4;
  long t3;
  long t2;
  long tl;
  long tf;
  long ipos;
  long im4;
  long im3;
  long im2;
  long im1;
  long it4;
  long it3;
  long it2;
  long it1;
  long i4;
  long i3;
  long i2;
  long i1;
  long inc [6];
  long tilefpix [6];
  long imglpix [6];
  long imgfpix [6];
  long tiledim [6];
  long imgdim [6];
  long local_230;
  long local_228;
  long local_220;
  int local_214;
  int local_20c;
  long local_1f8;
  long local_1f0;
  long local_1d0;
  long local_1c8;
  long local_1c0;
  long local_1b8;
  long local_1b0;
  long local_1a8;
  long local_1a0;
  long local_198;
  long local_190;
  long local_188;
  long local_180;
  long local_178;
  long local_170;
  long local_168;
  long local_160;
  long local_158 [6];
  long local_128 [6];
  long local_f8 [6];
  long local_c8 [6];
  long local_98 [6];
  long local_68 [8];
  long local_28;
  long local_20;
  int local_18;
  int local_14;
  long local_10;
  int local_4;
  
  if (*_overlap_bytes < 1) {
    for (local_20c = 0; local_20c < 6; local_20c = local_20c + 1) {
      local_158[local_20c] = 1;
      local_68[local_20c] = 1;
      local_98[local_20c] = 1;
      local_c8[local_20c] = 0;
      local_f8[local_20c] = 0;
      local_128[local_20c] = 0;
    }
    local_28 = in_R8;
    local_20 = in_RCX;
    local_18 = in_EDX;
    local_14 = in_ESI;
    local_10 = in_RDI;
    for (local_20c = 0; local_20c < local_18; local_20c = local_20c + 1) {
      if ((*(long *)(local_28 + (long)local_20c * 8) <
           *(long *)(in_stack_00000010 + (long)local_20c * 8)) ||
         (*(long *)(in_stack_00000018 + (long)local_20c * 8) <
          *(long *)(local_20 + (long)local_20c * 8))) {
        return *_overlap_bytes;
      }
      lVar2 = local_158[local_20c];
      if (lVar2 < 1) {
        lVar2 = -lVar2;
      }
      local_68[local_20c] =
           (*(long *)(in_stack_00000018 + (long)local_20c * 8) -
           *(long *)(in_stack_00000010 + (long)local_20c * 8)) / lVar2 + 1;
      if (local_68[local_20c] < 1) {
        *_overlap_bytes = 0x143;
        return 0x143;
      }
      local_98[local_20c] =
           (*(long *)(local_28 + (long)local_20c * 8) - *(long *)(local_20 + (long)local_20c * 8)) +
           1;
      if (local_98[local_20c] < 1) {
        *_overlap_bytes = 0x143;
        return 0x143;
      }
      if (0 < local_20c) {
        local_98[local_20c] = local_98[local_20c + -1] * local_98[local_20c];
      }
      local_1c8 = *(long *)(local_20 + (long)local_20c * 8) + -1;
      local_1d0 = *(long *)(local_28 + (long)local_20c * 8) + -1;
      while( true ) {
        lVar2 = local_158[local_20c];
        if (lVar2 < 1) {
          lVar2 = -lVar2;
        }
        if ((local_1c8 - (*(long *)(in_stack_00000010 + (long)local_20c * 8) + -1)) % lVar2 == 0)
        break;
        local_1c8 = local_1c8 + 1;
        if (local_1d0 < local_1c8) {
          return *_overlap_bytes;
        }
      }
      while( true ) {
        lVar2 = local_158[local_20c];
        if (lVar2 < 1) {
          lVar2 = -lVar2;
        }
        if ((local_1d0 - (*(long *)(in_stack_00000010 + (long)local_20c * 8) + -1)) % lVar2 == 0)
        break;
        local_1d0 = local_1d0 + -1;
        if (local_1d0 < local_1c8) {
          return *_overlap_bytes;
        }
      }
      lVar2 = local_158[local_20c];
      if (lVar2 < 1) {
        lVar2 = -lVar2;
      }
      if (((local_1c8 - *(long *)(in_stack_00000010 + (long)local_20c * 8)) + 1) / lVar2 < 1) {
        local_220 = 0;
      }
      else {
        local_220 = local_158[local_20c];
        if (local_220 < 1) {
          local_220 = -local_220;
        }
        local_220 = ((local_1c8 - *(long *)(in_stack_00000010 + (long)local_20c * 8)) + 1) /
                    local_220;
      }
      local_c8[local_20c] = local_220;
      lVar2 = local_158[local_20c];
      if (lVar2 < 1) {
        lVar2 = -lVar2;
      }
      if (((local_1d0 - *(long *)(in_stack_00000010 + (long)local_20c * 8)) + 1) / lVar2 <
          local_68[local_20c] + -1) {
        local_228 = local_158[local_20c];
        if (local_228 < 1) {
          local_228 = -local_228;
        }
        local_228 = ((local_1d0 - *(long *)(in_stack_00000010 + (long)local_20c * 8)) + 1) /
                    local_228;
      }
      else {
        local_228 = local_68[local_20c] + -1;
      }
      local_f8[local_20c] = local_228;
      if (*(long *)(in_stack_00000010 + (long)local_20c * 8) -
          *(long *)(local_20 + (long)local_20c * 8) < 1) {
        local_230 = 0;
      }
      else {
        local_230 = *(long *)(in_stack_00000010 + (long)local_20c * 8) -
                    *(long *)(local_20 + (long)local_20c * 8);
      }
      local_128[local_20c] = local_230;
      while( true ) {
        lVar2 = local_158[local_20c];
        if (lVar2 < 1) {
          lVar2 = -lVar2;
        }
        if (((*(long *)(local_20 + (long)local_20c * 8) + local_128[local_20c]) -
            *(long *)(in_stack_00000010 + (long)local_20c * 8)) % lVar2 == 0) break;
        local_128[local_20c] = local_128[local_20c] + 1;
        if (local_98[local_20c] <= local_128[local_20c]) {
          return *_overlap_bytes;
        }
      }
      if (0 < local_20c) {
        local_68[local_20c] = local_68[local_20c + -1] * local_68[local_20c];
      }
    }
    if (local_158[0] == 1) {
      local_214 = ((int)local_f8[0] - (int)local_c8[0]) + 1;
    }
    else {
      local_214 = 1;
    }
    iVar1 = local_214 * local_14;
    local_198 = 0;
    for (local_178 = 0; local_178 <= local_f8[4] - local_c8[4]; local_178 = local_178 + 1) {
      while( true ) {
        bVar6 = false;
        if (4 < local_18) {
          lVar2 = local_158[4];
          if (local_158[4] < 1) {
            lVar2 = -local_158[4];
          }
          bVar6 = (((*(long *)(local_20 + 0x20) + local_128[4]) -
                   *(long *)(in_stack_00000010 + 0x20)) + local_198) % lVar2 != 0;
        }
        if (!bVar6) break;
        local_198 = local_198 + 1;
      }
      if (local_158[4] < 1) {
        local_1b8 = local_68[4] - (local_178 + 1 + local_c8[4]) * local_68[3];
      }
      else {
        local_1b8 = (local_178 + local_c8[4]) * local_68[3];
      }
      lVar2 = (local_128[4] + local_198) * local_98[3];
      local_190 = 0;
      for (local_170 = 0; local_170 <= local_f8[3] - local_c8[3]; local_170 = local_170 + 1) {
        while( true ) {
          bVar6 = false;
          if (3 < local_18) {
            lVar3 = local_158[3];
            if (local_158[3] < 1) {
              lVar3 = -local_158[3];
            }
            bVar6 = (((*(long *)(local_20 + 0x18) + local_128[3]) -
                     *(long *)(in_stack_00000010 + 0x18)) + local_190) % lVar3 != 0;
          }
          if (!bVar6) break;
          local_190 = local_190 + 1;
        }
        if (local_158[3] < 1) {
          local_1b0 = local_68[3] - (local_170 + 1 + local_c8[3]) * local_68[2];
        }
        else {
          local_1b0 = (local_170 + local_c8[3]) * local_68[2];
        }
        local_1b0 = local_1b0 + local_1b8;
        lVar3 = (local_128[3] + local_190) * local_98[2];
        local_188 = 0;
        for (local_168 = 0; local_168 <= local_f8[2] - local_c8[2]; local_168 = local_168 + 1) {
          while( true ) {
            bVar6 = false;
            if (2 < local_18) {
              lVar4 = local_158[2];
              if (local_158[2] < 1) {
                lVar4 = -local_158[2];
              }
              bVar6 = (((*(long *)(local_20 + 0x10) + local_128[2]) -
                       *(long *)(in_stack_00000010 + 0x10)) + local_188) % lVar4 != 0;
            }
            if (!bVar6) break;
            local_188 = local_188 + 1;
          }
          if (local_158[2] < 1) {
            local_1a8 = local_68[2] - (local_168 + 1 + local_c8[2]) * local_68[1];
          }
          else {
            local_1a8 = (local_168 + local_c8[2]) * local_68[1];
          }
          local_1a8 = local_1a8 + local_1b0;
          lVar4 = (local_128[2] + local_188) * local_98[1];
          local_180 = 0;
          for (local_160 = 0; local_160 <= local_f8[1] - local_c8[1]; local_160 = local_160 + 1) {
            while( true ) {
              bVar6 = false;
              if (1 < local_18) {
                lVar5 = local_158[1];
                if (local_158[1] < 1) {
                  lVar5 = -local_158[1];
                }
                bVar6 = (((*(long *)(local_20 + 8) + local_128[1]) -
                         *(long *)(in_stack_00000010 + 8)) + local_180) % lVar5 != 0;
              }
              if (!bVar6) break;
              local_180 = local_180 + 1;
            }
            local_1f0 = local_128[0] + (local_128[1] + local_180) * local_98[0] +
                        lVar4 + lVar3 + lVar2;
            if (local_158[1] < 1) {
              local_1a0 = local_68[1] - (local_160 + 1 + local_c8[1]) * local_68[0];
            }
            else {
              local_1a0 = (local_160 + local_c8[1]) * local_68[0];
            }
            local_1a0 = local_1a0 + local_1a8;
            local_1f8 = local_c8[0];
            if (local_158[0] < 1) {
              local_1f8 = (local_68[0] + -1) - local_c8[0];
            }
            local_1f8 = local_1f8 + local_1a0;
            for (local_1c0 = local_c8[0]; local_1c0 <= local_f8[0];
                local_1c0 = local_214 + local_1c0) {
              memcpy((void *)(local_10 + local_1f0 * local_14),
                     (void *)(in_stack_00000008 + local_1f8 * local_14),(long)iVar1);
              lVar5 = local_158[0];
              if (local_158[0] < 1) {
                lVar5 = -local_158[0];
              }
              local_1f0 = local_214 * lVar5 + local_1f0;
              if (local_158[0] < 1) {
                lVar5 = -(long)local_214;
              }
              else {
                lVar5 = (long)local_214;
              }
              local_1f8 = lVar5 + local_1f8;
            }
            local_180 = local_180 + 1;
          }
          local_188 = local_188 + 1;
        }
        local_190 = local_190 + 1;
      }
      local_198 = local_198 + 1;
    }
    local_4 = *_overlap_bytes;
  }
  else {
    local_4 = *_overlap_bytes;
  }
  return local_4;
}

Assistant:

int imcomp_merge_overlap (
    char *tile,         /* O - multi dimensional array of tile pixels */
    int pixlen,         /* I - number of bytes in each tile or image pixel */
    int ndim,           /* I - number of dimension in the tile and image */
    long *tfpixel,      /* I - first pixel number in each dim. of the tile */
    long *tlpixel,      /* I - last pixel number in each dim. of the tile */
    char *bnullarray,   /* I - array of null flags; used if nullcheck = 2 */
    char *image,        /* I - multi dimensional output image */
    long *fpixel,       /* I - first pixel number in each dim. of the image */
    long *lpixel,       /* I - last pixel number in each dim. of the image */
    int nullcheck,      /* I - 0, 1: do nothing; 2: set nullarray for nulls */
    int *status)

/* 
  Similar to imcomp_copy_overlap, except it copies the overlapping pixels from
  the 'image' to the 'tile'.
*/
{
    long imgdim[MAX_COMPRESS_DIM]; /* product of preceding dimensions in the */
                                   /* output image, allowing for inc factor */
    long tiledim[MAX_COMPRESS_DIM]; /* product of preceding dimensions in the */
                                 /* tile, array;  inc factor is not relevant */
    long imgfpix[MAX_COMPRESS_DIM]; /* 1st img pix overlapping tile: 0 base, */
                                    /*  allowing for inc factor */
    long imglpix[MAX_COMPRESS_DIM]; /* last img pix overlapping tile 0 base, */
                                    /*  allowing for inc factor */
    long tilefpix[MAX_COMPRESS_DIM]; /* 1st tile pix overlapping img 0 base, */
                                    /*  allowing for inc factor */
    long inc[MAX_COMPRESS_DIM]; /* local copy of input ininc */
    long i1, i2, i3, i4;   /* offset along each axis of the image */
    long it1, it2, it3, it4;
    long im1, im2, im3, im4;  /* offset to image pixel, allowing for inc */
    long ipos, tf, tl;
    long t2, t3, t4;   /* offset along each axis of the tile */
    long tilepix, imgpix, tilepixbyte, imgpixbyte;
    int ii, overlap_bytes, overlap_flags;

    if (*status > 0)
        return(*status);

    for (ii = 0; ii < MAX_COMPRESS_DIM; ii++)
    {
        /* set default values for higher dimensions */
        inc[ii] = 1;
        imgdim[ii] = 1;
        tiledim[ii] = 1;
        imgfpix[ii] = 0;
        imglpix[ii] = 0;
        tilefpix[ii] = 0;
    }

    /* ------------------------------------------------------------ */
    /* calc amount of overlap in each dimension; if there is zero   */
    /* overlap in any dimension then just return  */
    /* ------------------------------------------------------------ */
    
    for (ii = 0; ii < ndim; ii++)
    {
        if (tlpixel[ii] < fpixel[ii] || tfpixel[ii] > lpixel[ii])
            return(*status);  /* there are no overlapping pixels */

        /* calc dimensions of the output image section */
        imgdim[ii] = (lpixel[ii] - fpixel[ii]) / labs(inc[ii]) + 1;
        if (imgdim[ii] < 1)
            return(*status = NEG_AXIS);

        /* calc dimensions of the tile */
        tiledim[ii] = tlpixel[ii] - tfpixel[ii] + 1;
        if (tiledim[ii] < 1)
            return(*status = NEG_AXIS);

        if (ii > 0)
           tiledim[ii] *= tiledim[ii - 1];  /* product of dimensions */

        /* first and last pixels in image that overlap with the tile, 0 base */
        tf = tfpixel[ii] - 1;
        tl = tlpixel[ii] - 1;

        /* skip this plane if it falls in the cracks of the subsampled image */
        while ((tf-(fpixel[ii] - 1)) % labs(inc[ii]))
        {
           tf++;
           if (tf > tl)
             return(*status);  /* no overlapping pixels */
        }

        while ((tl-(fpixel[ii] - 1)) % labs(inc[ii]))
        {
           tl--;
           if (tf > tl)
             return(*status);  /* no overlapping pixels */
        }
        imgfpix[ii] = maxvalue((tf - fpixel[ii] +1) / labs(inc[ii]) , 0);
        imglpix[ii] = minvalue((tl - fpixel[ii] +1) / labs(inc[ii]) ,
                               imgdim[ii] - 1);

        /* first pixel in the tile that overlaps with the image (0 base) */
        tilefpix[ii] = maxvalue(fpixel[ii] - tfpixel[ii], 0);

        while ((tfpixel[ii] + tilefpix[ii] - fpixel[ii]) % labs(inc[ii]))
        {
           (tilefpix[ii])++;
           if (tilefpix[ii] >= tiledim[ii])
              return(*status);  /* no overlapping pixels */
        }
/*
printf("ii tfpixel, tlpixel %d %d %d \n",ii, tfpixel[ii], tlpixel[ii]);
printf("ii, tf, tl, imgfpix,imglpix, tilefpix %d %d %d %d %d %d\n",ii,
 tf,tl,imgfpix[ii], imglpix[ii],tilefpix[ii]);
*/
        if (ii > 0)
           imgdim[ii] *= imgdim[ii - 1];  /* product of dimensions */
    }

    /* ---------------------------------------------------------------- */
    /* calc number of pixels in each row (first dimension) that overlap */
    /* multiply by pixlen to get number of bytes to copy in each loop   */
    /* ---------------------------------------------------------------- */

    if (inc[0] != 1)
       overlap_flags = 1;  /* can only copy 1 pixel at a time */
    else
       overlap_flags = imglpix[0] - imgfpix[0] + 1;  /* can copy whole row */

    overlap_bytes = overlap_flags * pixlen;

    /* support up to 5 dimensions for now */
    for (i4 = 0, it4=0; i4 <= imglpix[4] - imgfpix[4]; i4++, it4++)
    {
     /* increment plane if it falls in the cracks of the subsampled image */
     while (ndim > 4 &&  (tfpixel[4] + tilefpix[4] - fpixel[4] + it4)
                          % labs(inc[4]) != 0)
        it4++;

       /* offset to start of hypercube */
       if (inc[4] > 0)
          im4 = (i4 + imgfpix[4]) * imgdim[3];
       else
          im4 = imgdim[4] - (i4 + 1 + imgfpix[4]) * imgdim[3];

      t4 = (tilefpix[4] + it4) * tiledim[3];
      for (i3 = 0, it3=0; i3 <= imglpix[3] - imgfpix[3]; i3++, it3++)
      {
       /* increment plane if it falls in the cracks of the subsampled image */
       while (ndim > 3 &&  (tfpixel[3] + tilefpix[3] - fpixel[3] + it3)
                            % labs(inc[3]) != 0)
          it3++;

       /* offset to start of cube */
       if (inc[3] > 0)
          im3 = (i3 + imgfpix[3]) * imgdim[2] + im4;
       else
          im3 = imgdim[3] - (i3 + 1 + imgfpix[3]) * imgdim[2] + im4;

       t3 = (tilefpix[3] + it3) * tiledim[2] + t4;

       /* loop through planes of the image */
       for (i2 = 0, it2=0; i2 <= imglpix[2] - imgfpix[2]; i2++, it2++)
       {
          /* incre plane if it falls in the cracks of the subsampled image */
          while (ndim > 2 &&  (tfpixel[2] + tilefpix[2] - fpixel[2] + it2)
                               % labs(inc[2]) != 0)
             it2++;

          /* offset to start of plane */
          if (inc[2] > 0)
             im2 = (i2 + imgfpix[2]) * imgdim[1] + im3;
          else
             im2 = imgdim[2] - (i2 + 1 + imgfpix[2]) * imgdim[1] + im3;

          t2 = (tilefpix[2] + it2) * tiledim[1] + t3;

          /* loop through rows of the image */
          for (i1 = 0, it1=0; i1 <= imglpix[1] - imgfpix[1]; i1++, it1++)
          {
             /* incre row if it falls in the cracks of the subsampled image */
             while (ndim > 1 &&  (tfpixel[1] + tilefpix[1] - fpixel[1] + it1)
                                  % labs(inc[1]) != 0)
                it1++;

             /* calc position of first pixel in tile to be copied */
             tilepix = tilefpix[0] + (tilefpix[1] + it1) * tiledim[0] + t2;

             /* offset to start of row */
             if (inc[1] > 0)
                im1 = (i1 + imgfpix[1]) * imgdim[0] + im2;
             else
                im1 = imgdim[1] - (i1 + 1 + imgfpix[1]) * imgdim[0] + im2;
/*
printf("inc = %d %d %d %d\n",inc[0],inc[1],inc[2],inc[3]);
printf("im1,im2,im3,im4 = %d %d %d %d\n",im1,im2,im3,im4);
*/
             /* offset to byte within the row */
             if (inc[0] > 0)
                imgpix = imgfpix[0] + im1;
             else
                imgpix = imgdim[0] - 1 - imgfpix[0] + im1;
/*
printf("tilefpix0,1, imgfpix1, it1, inc1, t2= %d %d %d %d %d %d\n",
       tilefpix[0],tilefpix[1],imgfpix[1],it1,inc[1], t2);
printf("i1, it1, tilepix, imgpix %d %d %d %d \n", i1, it1, tilepix, imgpix);
*/
             /* loop over pixels along one row of the image */
             for (ipos = imgfpix[0]; ipos <= imglpix[0]; ipos += overlap_flags)
             {
               /* convert from image pixel to byte offset */
               tilepixbyte = tilepix * pixlen;
               imgpixbyte  = imgpix  * pixlen;
/*
printf("  tilepix, tilepixbyte, imgpix, imgpixbyte= %d %d %d %d\n",
          tilepix, tilepixbyte, imgpix, imgpixbyte);
*/
               /* copy overlapping row of pixels from image to tile */
               memcpy(tile + tilepixbyte, image + imgpixbyte,  overlap_bytes);

               tilepix += (overlap_flags * labs(inc[0]));
               if (inc[0] > 0)
                 imgpix += overlap_flags;
               else
                 imgpix -= overlap_flags;
            }
          }
        }
      }
    }
    return(*status);
}